

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void HashmapSortRehash(jx9_hashmap *pMap)

{
  jx9_hashmap_node *pjVar1;
  jx9_hashmap_node *pEntry;
  jx9_hashmap_node *pjVar2;
  uint uVar3;
  
  pMap->iNextIdx = 0;
  pjVar1 = pMap->pFirst;
  pjVar2 = pMap->pFirst;
  for (uVar3 = 0; pEntry = pjVar1, uVar3 < pMap->nEntry; uVar3 = uVar3 + 1) {
    if (pEntry->iType == 2) {
      SyBlobRelease(&(pEntry->xKey).sKey);
      pEntry->iType = 1;
    }
    HashmapRehashIntNode(pEntry);
    pjVar1 = pEntry->pPrev;
    pjVar2 = pEntry;
  }
  pMap->pLast = pjVar2;
  return;
}

Assistant:

static void HashmapSortRehash(jx9_hashmap *pMap)
{
	jx9_hashmap_node *p, *pLast;
	sxu32 i;
	/* Rehash all entries */
	pLast = p = pMap->pFirst;
	pMap->iNextIdx = 0; /* Reset the automatic index */
	i = 0;
	for( ;; ){
		if( i >= pMap->nEntry ){
			pMap->pLast = pLast; /* Fix the last link broken by the merge-sort */
			break;
		}
		if( p->iType == HASHMAP_BLOB_NODE ){
			/* Do not maintain index association as requested by the JX9 specification */
			SyBlobRelease(&p->xKey.sKey);
			/* Change key type */
			p->iType = HASHMAP_INT_NODE;
		}
		HashmapRehashIntNode(p);
		/* Point to the next entry */
		i++;
		pLast = p;
		p = p->pPrev; /* Reverse link */
	}
}